

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

bool __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::setValue
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *this,int inVal)

{
  if (this->needPush == true) {
    std::__cxx11::list<int,_std::allocator<int>_>::push_front
              (&this->value,
               (value_type_conflict *)
               ((this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next + 1));
    std::__cxx11::
    list<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::push_front(&(this->super_VRDatum).attrList,
                 (value_type *)
                 ((this->super_VRDatum).attrList.
                  super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next + 1));
    this->needPush = false;
    this->pushed = true;
  }
  *(int *)&(this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next[1]._M_next = inVal;
  return true;
}

Assistant:

bool setValue(const T inVal) {
    // This is a little optimization.  You only need to push things
    // onto the stack if the value actually changes.
    if (needPush) {
      value.push_front( value.front() );
      attrList.push_front( attrList.front() );
      needPush = false;
      pushed = true;
    }
    value.front() = inVal;
    return true;
  }